

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

bool __thiscall
JsrtDebuggerStackFrame::Evaluate
          (JsrtDebuggerStackFrame *this,ScriptContext *scriptContext,char16 *source,int sourceLength
          ,bool isLibraryCode,bool forceSetValueProp,DynamicObject **evalResult)

{
  JsrtDebuggerObjectsManager *debuggerObjectsManager;
  code *pcVar1;
  ResolvedObject resolvedObject_00;
  IDiagObjectModelDisplay *aValue;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 extraout_var;
  JavascriptLibrary *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  undefined4 *puVar6;
  RecyclableObject *this_01;
  void *unaff_retaddr;
  undefined8 local_1b8 [2];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  code *local_178;
  undefined8 local_170;
  TrackAllocData local_168;
  charcount_t local_140;
  charcount_t len;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  OutOfMemoryException anon_var_0_5;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_1;
  JavascriptExceptionObject *_exceptionObject;
  JavascriptException *err;
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  AutoNestedHandledExceptionType local_9c;
  JavascriptExceptionObject *pJStack_98;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  JavascriptExceptionObject *exceptionObject;
  ScriptContext *frameScriptContext;
  undefined1 local_80 [4];
  HRESULT hr;
  ResolvedObject resolvedObject;
  bool success;
  bool forceSetValueProp_local;
  bool isLibraryCode_local;
  int sourceLength_local;
  char16 *source_local;
  ScriptContext *scriptContext_local;
  JsrtDebuggerStackFrame *this_local;
  TypeId local_18;
  TypeId typeId;
  ScriptContext *scriptContext_00;
  
  *evalResult = (DynamicObject *)0x0;
  resolvedObject.typeId._1_1_ = TypeIds_Undefined >> 8;
  if (this->stackFrame != (DiagStackFrame *)0x0) {
    resolvedObject.typeId._2_1_ = forceSetValueProp;
    resolvedObject.typeId._3_1_ = isLibraryCode;
    resolvedObject._60_4_ = sourceLength;
    Js::ResolvedObject::ResolvedObject((ResolvedObject *)local_80);
    iVar3 = (*this->stackFrame->_vptr_DiagStackFrame[10])();
    scriptContext_00 = (ScriptContext *)CONCAT44(extraout_var,iVar3);
    pJStack_98 = (JavascriptExceptionObject *)0x0;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_9c,
               ExceptionType_JavascriptException|ExceptionType_StackOverflow|
               ExceptionType_OutOfMemory);
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)&err,scriptContext_00,
               (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
               false,false,false);
    Js::ScriptContext::OnScriptStart(scriptContext_00,false,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&err);
    Js::ScriptContext::EnforceEERHasCaller(scriptContext_00);
    Js::DiagStackFrame::EvaluateImmediate
              (this->stackFrame,source,resolvedObject._60_4_,(byte)resolvedObject.typeId._3_1_ & 1,
               (ResolvedObject *)local_80);
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)&err);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_9c);
    if (resolvedObject.objectDisplay == (IDiagObjectModelDisplay *)0x0) {
      resolvedObject.originalObj = anon_var_dwarf_1bbb0c;
      resolvedObject.name._0_4_ = 0x24;
      resolvedObject.scriptContext = (ScriptContext *)0x0;
      if (pJStack_98 == (JavascriptExceptionObject *)0x0) {
        this_00 = Js::ScriptContext::GetLibrary(scriptContext);
        resolvedObject.objectDisplay =
             (IDiagObjectModelDisplay *)
             Js::JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      }
      else {
        resolvedObject.objectDisplay =
             (IDiagObjectModelDisplay *)
             Js::JavascriptExceptionObject::GetThrownObject(pJStack_98,scriptContext);
      }
    }
    else {
      resolvedObject.typeId._1_1_ = 1;
    }
    if (resolvedObject.objectDisplay != (IDiagObjectModelDisplay *)0x0) {
      resolvedObject._0_8_ = scriptContext_00;
      local_140 = Js::JavascriptString::GetBufferLength(source);
      pAVar5 = &JsrtDebuggerObjectsManager::GetDebugObjectArena(this->debuggerObjectsManager)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_168,(type_info *)&char16_t::typeinfo,0,(ulong)(local_140 + 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                 ,0x204);
      pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar5,&local_168);
      local_178 = Memory::ArenaAllocator::NoThrowAlloc;
      local_170 = 0;
      resolvedObject.originalObj =
           Memory::AllocateArray<Memory::ArenaAllocator,char16_t,true>
                     ((Memory *)pAVar5,(ArenaAllocator *)Memory::ArenaAllocator::NoThrowAlloc,0,
                      (ulong)(local_140 + 1));
      if ((char16_t *)resolvedObject.originalObj == (char16_t *)0x0) {
        resolvedObject.originalObj = L"";
      }
      else {
        wcscpy_s((WCHAR *)resolvedObject.originalObj,(ulong)(local_140 + 1),source);
      }
      aValue = resolvedObject.objectDisplay;
      if (resolvedObject.objectDisplay == (IDiagObjectModelDisplay *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = Js::TaggedInt::Is(aValue);
      if (bVar2) {
        local_18 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = Js::JavascriptNumber::Is_NoTaggedIntCheck(aValue);
        if (bVar2) {
          local_18 = TypeIds_Number;
        }
        else {
          this_01 = Js::UnsafeVarTo<Js::RecyclableObject>(aValue);
          if (this_01 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                               ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_18 = Js::RecyclableObject::GetTypeId(this_01);
          if ((0x57 < (int)local_18) &&
             (BVar4 = Js::RecyclableObject::IsExternal(this_01), BVar4 == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                               ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                               "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
      }
      resolvedObject.name._0_4_ = local_18;
      debuggerObjectsManager = this->debuggerObjectsManager;
      memcpy(local_1b8,local_80,0x40);
      resolvedObject_00.scriptContext._0_4_ = (int)local_1b8[1];
      resolvedObject_00._0_8_ = local_1b8[0];
      resolvedObject_00.scriptContext._4_4_ = (int)((ulong)local_1b8[1] >> 0x20);
      resolvedObject_00.address = (IDiagObjectAddress *)local_1a8;
      resolvedObject_00.objectDisplay = (IDiagObjectModelDisplay *)uStack_1a0;
      resolvedObject_00.obj = (Var)local_198;
      resolvedObject_00.originalObj = (Var)uStack_190;
      resolvedObject_00.name = (LPCWSTR)local_188;
      resolvedObject_00.typeId = (undefined4)uStack_180;
      resolvedObject_00.isConst = (bool)uStack_180._4_1_;
      resolvedObject_00._61_3_ = uStack_180._5_3_;
      JsrtDebuggerObjectBase::
      CreateDebuggerObject<JsrtDebuggerObjectProperty,JsrtDebuggerStackFrame::Evaluate(Js::ScriptContext*,char16_t_const*,int,bool,bool,Js::DynamicObject**)::__0>
                (debuggerObjectsManager,resolvedObject_00,scriptContext,
                 (bool)(resolvedObject.typeId._2_1_ & 1),(anon_class_8_1_9522c997)&evalResult);
    }
  }
  return (bool)(resolvedObject.typeId._1_1_ & 1);
}

Assistant:

bool JsrtDebuggerStackFrame::Evaluate(Js::ScriptContext* scriptContext, const char16 *source, int sourceLength, bool isLibraryCode, bool forceSetValueProp, Js::DynamicObject** evalResult)
{
    *evalResult = nullptr;
    bool success = false;
    if (this->stackFrame != nullptr)
    {
        Js::ResolvedObject resolvedObject;
        HRESULT hr = S_OK;
        Js::ScriptContext* frameScriptContext = this->stackFrame->GetScriptContext();

        Js::JavascriptExceptionObject *exceptionObject = nullptr;
        {
            BEGIN_JS_RUNTIME_CALL_EX_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED(frameScriptContext, false)
            {
                ENFORCE_ENTRYEXITRECORD_HASCALLER(frameScriptContext);
                this->stackFrame->EvaluateImmediate(source, sourceLength, isLibraryCode, &resolvedObject);
            }
            END_JS_RUNTIME_CALL_AND_TRANSLATE_AND_GET_EXCEPTION_AND_ERROROBJECT_TO_HRESULT(hr, frameScriptContext, exceptionObject);
        }

        if (resolvedObject.obj == nullptr)
        {
            resolvedObject.name = _u("{exception}");
            resolvedObject.typeId = Js::TypeIds_Error;
            resolvedObject.address = nullptr;

            if (exceptionObject != nullptr)
            {
                resolvedObject.obj = exceptionObject->GetThrownObject(scriptContext);
            }
            else
            {
                resolvedObject.obj = scriptContext->GetLibrary()->GetUndefined();
            }
        }
        else
        {
          success = true;
        }

        if (resolvedObject.obj != nullptr)
        {
            resolvedObject.scriptContext = frameScriptContext;

            charcount_t len = Js::JavascriptString::GetBufferLength(source);
            resolvedObject.name = AnewNoThrowArray(this->debuggerObjectsManager->GetDebugObjectArena(), WCHAR, len + 1);

            if (resolvedObject.name != nullptr)
            {
                wcscpy_s((WCHAR*)resolvedObject.name, len + 1, source);
            }
            else
            {
                // len can be big, if we failed just have empty string
                resolvedObject.name = _u("");
            }

            resolvedObject.typeId = Js::JavascriptOperators::GetTypeId(resolvedObject.obj);
            JsrtDebuggerObjectBase::CreateDebuggerObject<JsrtDebuggerObjectProperty>(this->debuggerObjectsManager, resolvedObject, scriptContext, forceSetValueProp, [&](Js::Var marshaledObj)
            {
                *evalResult = (Js::DynamicObject*)marshaledObj;
            });
        }
    }
    return success;
}